

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

NondegeneracyCheckResult * __thiscall
slang::ast::BinaryAssertionExpr::checkNondegeneracyImpl
          (NondegeneracyCheckResult *__return_storage_ptr__,BinaryAssertionExpr *this)

{
  uint uVar1;
  uint uVar2;
  underlying_type uVar3;
  optional<slang::ast::SequenceRange> oVar4;
  _Optional_base<slang::ast::SequenceRange,_true,_true> _Var5;
  bool rightAdmitsNoMatch;
  bool leftAdmitsNoMatch;
  anon_class_48_6_03f1c37d joinNoMatchReasons;
  NondegeneracyCheckResult rightNondegen;
  NondegeneracyCheckResult leftNondegen;
  
  AssertionExpr::checkNondegeneracy(&leftNondegen,this->left);
  AssertionExpr::checkNondegeneracy(&rightNondegen,this->right);
  uVar2 = leftNondegen.status.m_bits & 4;
  joinNoMatchReasons.leftAdmitsNoMatch = &leftAdmitsNoMatch;
  leftAdmitsNoMatch = SUB41(uVar2 >> 2,0);
  uVar1 = rightNondegen.status.m_bits & 4;
  joinNoMatchReasons.rightAdmitsNoMatch = &rightAdmitsNoMatch;
  (__return_storage_ptr__->status).m_bits = 0;
  rightAdmitsNoMatch = SUB41(uVar1 >> 2,0);
  (__return_storage_ptr__->noMatchRange).startLoc = (SourceLocation)0x0;
  (__return_storage_ptr__->noMatchRange).endLoc = (SourceLocation)0x0;
  __return_storage_ptr__->isAlwaysFalse = false;
  joinNoMatchReasons.res = __return_storage_ptr__;
  joinNoMatchReasons.leftNondegen = &leftNondegen;
  joinNoMatchReasons.rightNondegen = &rightNondegen;
  joinNoMatchReasons.this = this;
  switch(this->op) {
  case And:
    if ((rightNondegen.status.m_bits & leftNondegen.status.m_bits & 1) == 0) {
      uVar3 = 4;
    }
    else {
      (__return_storage_ptr__->status).m_bits = 1;
      uVar3 = 5;
    }
    if (uVar2 == 0 && uVar1 == 0) {
      return __return_storage_ptr__;
    }
    break;
  case Or:
    if (((rightNondegen.status.m_bits | leftNondegen.status.m_bits) & 1) == 0) {
      uVar3 = 4;
    }
    else {
      (__return_storage_ptr__->status).m_bits = 1;
      uVar3 = 5;
    }
    if (uVar2 == 0 || uVar1 == 0) {
      return __return_storage_ptr__;
    }
    break;
  case Intersect:
    if ((rightNondegen.status.m_bits & leftNondegen.status.m_bits & 1) != 0) {
      (__return_storage_ptr__->status).m_bits = 1;
    }
    oVar4 = AssertionExpr::computeSequenceLength(this->left);
    uVar1 = oVar4.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_4_;
    _Var5._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> =
         (_Optional_payload<slang::ast::SequenceRange,_true,_true,_true>)
         AssertionExpr::computeSequenceLength(this->right);
    if ((leftAdmitsNoMatch == false) && (rightAdmitsNoMatch == false)) {
      if ((oVar4.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::SequenceRange>._8_8_ >> 0x20 & 1) == 0) {
        return __return_storage_ptr__;
      }
      if (((undefined1  [16])
           _Var5._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> &
          (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
        return __return_storage_ptr__;
      }
      if ((((undefined1  [16])
            oVar4.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRange> & (undefined1  [16])0x1) ==
           (undefined1  [16])0x0) ||
         (_Var5._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_4_
          <= oVar4.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._4_4_))
      goto LAB_003b9856;
    }
    goto LAB_003b98a0;
  case Throughout:
    if ((rightNondegen.status.m_bits & 1) == 0) {
      uVar3 = 4;
    }
    else {
      (__return_storage_ptr__->status).m_bits = 1;
      uVar3 = 5;
    }
    if (uVar1 == 0) {
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->status).m_bits = uVar3;
    (__return_storage_ptr__->noMatchRange).startLoc = rightNondegen.noMatchRange.startLoc;
    (__return_storage_ptr__->noMatchRange).endLoc = rightNondegen.noMatchRange.endLoc;
    __return_storage_ptr__->isAlwaysFalse = rightNondegen.isAlwaysFalse;
    return __return_storage_ptr__;
  case Within:
    if ((rightNondegen.status.m_bits & leftNondegen.status.m_bits & 1) != 0) {
      (__return_storage_ptr__->status).m_bits = 1;
    }
    oVar4 = AssertionExpr::computeSequenceLength(this->left);
    uVar1 = oVar4.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_4_;
    _Var5._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> =
         (_Optional_payload<slang::ast::SequenceRange,_true,_true,_true>)
         AssertionExpr::computeSequenceLength(this->right);
    if ((leftAdmitsNoMatch == false) && (rightAdmitsNoMatch == false)) {
      if ((oVar4.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::SequenceRange>._8_8_ >> 0x20 & 1) == 0) {
        return __return_storage_ptr__;
      }
      if (((undefined1  [16])
           _Var5._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> &
          (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
        return __return_storage_ptr__;
      }
LAB_003b9856:
      if (((undefined1  [16])
           _Var5._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> &
          (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return __return_storage_ptr__;
      }
      if (uVar1 <= _Var5._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>.
                   _M_payload._4_4_) {
        return __return_storage_ptr__;
      }
    }
LAB_003b98a0:
    *(byte *)&(__return_storage_ptr__->status).m_bits =
         (byte)(__return_storage_ptr__->status).m_bits | 4;
    goto LAB_003b9902;
  default:
    goto switchD_003b97eb_default;
  }
  (__return_storage_ptr__->status).m_bits = uVar3;
LAB_003b9902:
  checkNondegeneracyImpl::anon_class_48_6_03f1c37d::operator()(&joinNoMatchReasons);
switchD_003b97eb_default:
  return __return_storage_ptr__;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult BinaryAssertionExpr::checkNondegeneracyImpl() const {
    const auto leftNondegen = left.checkNondegeneracy();
    const auto rightNondegen = right.checkNondegeneracy();
    const auto leftNondegenSt = leftNondegen.status;
    const auto rightNondegenSt = rightNondegen.status;
    const bool leftAdmitsEmpty = leftNondegenSt.has(NondegeneracyStatus::AdmitsEmpty);
    const bool rightAdmitsEmpty = rightNondegenSt.has(NondegeneracyStatus::AdmitsEmpty);
    const bool leftAdmitsNoMatch = leftNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch);
    const bool rightAdmitsNoMatch = rightNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch);

    NondegeneracyCheckResult res;
    auto joinNoMatchReasons = [&] {
        if (leftAdmitsNoMatch) {
            res.noMatchRange = leftNondegen.noMatchRange;
            res.isAlwaysFalse = leftNondegen.isAlwaysFalse;
        }
        else if (rightAdmitsNoMatch) {
            res.noMatchRange = rightNondegen.noMatchRange;
            res.isAlwaysFalse = rightNondegen.isAlwaysFalse;
        }
        else if (left.syntax && right.syntax) {
            res.noMatchRange = {left.syntax->getFirstToken().location(),
                                right.syntax->sourceRange().end()};
            res.isAlwaysFalse = false;
        }
    };

    switch (op) {
        case BinaryAssertionOperator::Or: {
            if (leftAdmitsEmpty || rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `or` full sequence is no match if and only if both parts are no match.
            if (leftAdmitsNoMatch && rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::And: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `and` full sequence is no match if and only if any part is no match.
            if (leftAdmitsNoMatch || rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Intersect: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `intersect` full sequence is no match if both parts don't have any
            // possible overlap in their length ranges.
            const auto leftLen = left.computeSequenceLength();
            const auto rightLen = right.computeSequenceLength();
            if (leftAdmitsNoMatch || rightAdmitsNoMatch ||
                (leftLen && rightLen && !leftLen->canIntersect(*rightLen))) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Within: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `within` full sequence is no match if left side delay range is within
            // right side delay range.
            const auto leftLen = left.computeSequenceLength();
            const auto rightLen = right.computeSequenceLength();
            if (leftAdmitsNoMatch || rightAdmitsNoMatch ||
                (leftLen && rightLen && !leftLen->canBeWithin(*rightLen))) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Throughout: {
            if (rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `throughout` full sequence is no match if right part is no match
            if (rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                res.noMatchRange = rightNondegen.noMatchRange;
                res.isAlwaysFalse = rightNondegen.isAlwaysFalse;
            }
            break;
        }
        default:
            break;
    }

    return res;
}